

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::DoBackgroundParallelMark(Recycler *this)

{
  ObservableValue<Memory::CollectionState> *pOVar1;
  MarkContext *markContext;
  MarkContext *markContext_00;
  MarkContext *this_00;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  CollectionState CVar7;
  undefined4 *puVar8;
  uint uVar9;
  MarkContext *local_68;
  MarkContext *splitContexts [2];
  CollectionState local_38;
  uint local_34;
  
  markContext = &this->parallelMarkContext2;
  markContext_00 = &this->parallelMarkContext3;
  local_68 = markContext;
  splitContexts[0] = markContext_00;
  if (this->enableParallelMark != true) {
LAB_0070ef5e:
    ProcessMark(this,false);
    return;
  }
  uVar9 = this->maxParallelism;
  if (2 < uVar9 - 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa3d,"(this->maxParallelism > 1 && this->maxParallelism <= 4)",
                       "this->maxParallelism > 1 && this->maxParallelism <= 4");
    if (!bVar4) goto LAB_0070f17b;
    *puVar8 = 0;
    uVar9 = this->maxParallelism;
  }
  if (uVar9 < 3) goto LAB_0070ef5e;
  this_00 = &this->markContext;
  uVar6 = MarkContext::Split(this_00,uVar9 - 2,&local_68);
  if (uVar6 < 3) {
    if (uVar6 == 0) goto LAB_0070ef5e;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa44,"(actualSplitCount <= 2)","actualSplitCount <= 2");
    if (!bVar4) goto LAB_0070f17b;
    *puVar8 = 0;
  }
  bVar4 = DoQueueTrackedObject(this);
  if ((!bVar4) && (this->inPartialCollectMode == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0xa4f,"(this->DoQueueTrackedObject() || this->inPartialCollectMode)",
                       "this->DoQueueTrackedObject() || this->inPartialCollectMode");
    if (!bVar4) {
LAB_0070f17b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  pOVar1 = &this->collectionState;
  local_38 = CollectionStateBackgroundParallelMark;
  pOVar2 = (this->collectionState).observer;
  local_34 = uVar6;
  if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateBackgroundParallelMark)) {
    (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,&local_38,pOVar1);
  }
  (this->collectionState).value = local_38;
  bVar4 = RecyclerParallelThread::StartConcurrent(&this->parallelThread1);
  if (local_34 == 2 && bVar4) {
    bVar5 = RecyclerParallelThread::StartConcurrent(&this->parallelThread2);
  }
  else {
    bVar5 = false;
  }
  if (this->enableScanInteriorPointers == true) {
    ProcessMarkContext<true,true>(this,this_00);
  }
  else {
    ProcessMarkContext<true,false>(this,this_00);
  }
  if (bVar4) {
    RecyclerParallelThread::WaitForConcurrent(&this->parallelThread1);
  }
  else if (this->enableScanInteriorPointers == true) {
    ProcessMarkContext<true,true>(this,markContext);
  }
  else {
    ProcessMarkContext<true,false>(this,markContext);
  }
  if (local_34 == 2) {
    if (bVar5 == false) {
      if (this->enableScanInteriorPointers == true) {
        ProcessMarkContext<true,true>(this,markContext_00);
      }
      else {
        ProcessMarkContext<true,false>(this,markContext_00);
      }
    }
    else {
      RecyclerParallelThread::WaitForConcurrent(&this->parallelThread2);
    }
  }
  local_38 = CollectionStateConcurrentMark;
  pOVar2 = (this->collectionState).observer;
  CVar7 = CollectionStateConcurrentMark;
  if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
     ((this->collectionState).value != CollectionStateConcurrentMark)) {
    (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,&local_38,pOVar1);
    CVar7 = local_38;
  }
  pOVar1->value = CVar7;
  return;
}

Assistant:

void
Recycler::DoBackgroundParallelMark()
{
    // Split the mark stack into [this->maxParallelism - 1] equal pieces (thus, "- 2" below).
    // The actual # of splits is returned, in case the stack was too small to split that many ways.
    // The parallel threads are hardwired to use parallelMarkContext2/3, so we split using those.
    uint actualSplitCount = 0;
    MarkContext * splitContexts[2] = { &parallelMarkContext2, &parallelMarkContext3 };
    if (this->enableParallelMark)
    {
        Assert(this->maxParallelism > 1 && this->maxParallelism <= 4);
        if (this->maxParallelism > 2)
        {
            actualSplitCount = markContext.Split(this->maxParallelism - 2, splitContexts);
        }
    }

    Assert(actualSplitCount <= 2);

    // If we failed to split at all, just mark in thread with no parallelism.
    if (actualSplitCount == 0)
    {
        this->ProcessMark(true);
        return;
    }

#if ENABLE_PARTIAL_GC
    // We should already be set up to queue tracked objects, unless this is a partial collect
    Assert(this->DoQueueTrackedObject() || this->inPartialCollectMode);
#else
    Assert(this->DoQueueTrackedObject());
#endif

    this->SetCollectionState(CollectionStateBackgroundParallelMark);

    // Kick off marking on parallel threads too, if there is work for them
    // If the threads haven't been created yet, this will create them (or fail).
    bool parallelSuccess1 = false;
    bool parallelSuccess2 = false;
    parallelSuccess1 = parallelThread1.StartConcurrent();
    if (parallelSuccess1 && actualSplitCount == 2)
    {
        parallelSuccess2 = parallelThread2.StartConcurrent();
    }

    // Process our portion of the split.
    this->ProcessParallelMark(true, &markContext);

    // If we successfully launched parallel work, wait for it to complete.
    // If we failed, then process the work in-thread now.
    if (parallelSuccess1)
    {
        parallelThread1.WaitForConcurrent();
    }
    else
    {
        this->ProcessParallelMark(true, &parallelMarkContext2);
    }

    if (actualSplitCount == 2)
    {
        if (parallelSuccess2)
        {
            parallelThread2.WaitForConcurrent();
        }
        else
        {
            this->ProcessParallelMark(true, &parallelMarkContext3);
        }
    }

    this->SetCollectionState(CollectionStateConcurrentMark);
}